

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

bool __thiscall TypeOp::markExplicitUnsigned(TypeOp *this,PcodeOp *op,int4 slot)

{
  Varnode *this_00;
  pointer ppVVar1;
  Varnode *this_01;
  HighVariable *pHVar2;
  Datatype *pDVar3;
  PcodeOp *pPVar4;
  
  if ((this->addlflags & 1) == 0) {
    return false;
  }
  if (((slot == 1 & (byte)((this->addlflags & 2) >> 1)) == 0) &&
     (this_00 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start[slot], (this_00->flags & 2) != 0)) {
    pHVar2 = Varnode::getHigh(this_00);
    pDVar3 = HighVariable::getType(pHVar2);
    if (((pDVar3->metatype == TYPE_UNKNOWN) || (pDVar3->metatype == TYPE_UINT)) &&
       ((pDVar3->flags & 0x36) == 0)) {
      ppVVar1 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar1 & 0x7fffffff8U) == 0x10) &&
         ((this->addlflags & 2) == 0)) {
        pHVar2 = Varnode::getHigh(ppVVar1[1 - slot]);
        pDVar3 = HighVariable::getType(pHVar2);
        if (pDVar3->metatype == TYPE_UINT) {
          return false;
        }
        if (pDVar3->metatype == TYPE_UNKNOWN) {
          return false;
        }
      }
      this_01 = op->output;
      if ((this_01 == (Varnode *)0x0) ||
         (((this_01->flags & 0x80) == 0 &&
          ((pPVar4 = Varnode::loneDescend(this_01), pPVar4 == (PcodeOp *)0x0 ||
           ((pPVar4->opcode->addlflags & 1) != 0)))))) {
        *(byte *)&this_00->addlflags = (byte)this_00->addlflags | 0x40;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool TypeOp::markExplicitUnsigned(PcodeOp *op,int4 slot) const

{
  if ((addlflags & inherits_sign)==0) return false;
  if ((slot==1) && ((addlflags & inherits_sign_zero)!=0)) return false;
  Varnode *vn = op->getIn(slot);
  if (!vn->isConstant()) return false;
  Datatype *dt = vn->getHigh()->getType();
  type_metatype meta = dt->getMetatype();
  if ((meta != TYPE_UINT)&&(meta != TYPE_UNKNOWN)) return false;
  if (dt->isCharPrint()) return false;
  if (dt->isEnumType()) return false;
  if ((op->numInput() == 2) && ((addlflags & inherits_sign_zero)==0)) {
    Varnode *firstvn = op->getIn(1-slot);
    meta = firstvn->getHigh()->getType()->getMetatype();
    if ((meta == TYPE_UINT)||(meta == TYPE_UNKNOWN))
      return false;		// Other side of the operation will force the unsigned
  }
  // Check if type is going to get forced anyway
  Varnode *outvn = op->getOut();
  if (outvn != (Varnode *)0) {
    if (outvn->isExplicit()) return false;
    PcodeOp *lone = outvn->loneDescend();
    if (lone != (PcodeOp *)0) {
      if (!lone->inheritsSign()) return false;
    }
  }

  vn->setUnsignedPrint();
  return true;
}